

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListWidgetItem::~QListWidgetItem(QListWidgetItem *this)

{
  QListModel *this_00;
  char *in_RDI;
  QListModel *model;
  QListWidgetItem *in_stack_ffffffffffffffe0;
  void *pvVar1;
  
  *(undefined ***)in_RDI = &PTR__QListWidgetItem_00d2f268;
  this_00 = listModel(in_stack_ffffffffffffffe0);
  if (this_00 != (QListModel *)0x0) {
    QListModel::remove(this_00,in_RDI);
  }
  pvVar1 = *(void **)(in_RDI + 0x18);
  if (pvVar1 != (void *)0x0) {
    QListWidgetItemPrivate::~QListWidgetItemPrivate((QListWidgetItemPrivate *)0x89bff4);
    operator_delete(pvVar1,0x28);
  }
  return;
}

Assistant:

QListWidgetItem::~QListWidgetItem()
{
    if (QListModel *model = listModel())
        model->remove(this);
    delete d;
}